

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

xmlParserErrors
xmlParserInputBufferCreateUrl
          (char *URI,xmlCharEncoding enc,xmlParserInputFlags flags,xmlParserInputBufferPtr *out)

{
  int iVar1;
  xmlParserInputBufferPtr buf_00;
  xmlInputCallback *pxVar2;
  void *pvVar3;
  long lVar4;
  xmlInputCallback *cb;
  int i;
  xmlParserErrors ret;
  xmlParserInputBufferPtr buf;
  xmlParserInputBufferPtr *out_local;
  xmlParserInputFlags flags_local;
  xmlCharEncoding enc_local;
  char *URI_local;
  
  xmlInitParser();
  *out = (xmlParserInputBufferPtr)0x0;
  if (URI == (char *)0x0) {
    URI_local._4_4_ = XML_ERR_ARGUMENT;
  }
  else {
    buf_00 = xmlAllocParserInputBuffer(enc);
    if (buf_00 == (xmlParserInputBufferPtr)0x0) {
      URI_local._4_4_ = XML_ERR_NO_MEMORY;
    }
    else {
      cb._4_4_ = XML_IO_ENOENT;
      cb._0_4_ = xmlInputCallbackNr;
      do {
        do {
          while( true ) {
            cb._0_4_ = (int)cb + -1;
            if ((int)cb < 0) goto LAB_0018071c;
            lVar4 = (long)(int)cb;
            pxVar2 = xmlInputCallbackTable + lVar4;
            if (pxVar2->matchcallback != xmlIODefaultMatch) break;
            cb._4_4_ = xmlInputDefaultOpen(buf_00,URI,flags);
            if ((cb._4_4_ == XML_ERR_OK) || (cb._4_4_ != XML_IO_ENOENT)) goto LAB_0018071c;
          }
        } while ((pxVar2->matchcallback == (xmlInputMatchCallback)0x0) ||
                (iVar1 = (*pxVar2->matchcallback)(URI), iVar1 == 0));
        pvVar3 = (*xmlInputCallbackTable[lVar4].opencallback)(URI);
        buf_00->context = pvVar3;
      } while (buf_00->context == (void *)0x0);
      buf_00->readcallback = xmlInputCallbackTable[lVar4].readcallback;
      buf_00->closecallback = xmlInputCallbackTable[lVar4].closecallback;
      cb._4_4_ = XML_ERR_OK;
LAB_0018071c:
      if (cb._4_4_ == XML_ERR_OK) {
        *out = buf_00;
        URI_local._4_4_ = cb._4_4_;
      }
      else {
        xmlFreeParserInputBuffer(buf_00);
        *out = (xmlParserInputBufferPtr)0x0;
        URI_local._4_4_ = cb._4_4_;
      }
    }
  }
  return URI_local._4_4_;
}

Assistant:

xmlParserErrors
xmlParserInputBufferCreateUrl(const char *URI, xmlCharEncoding enc,
                              xmlParserInputFlags flags,
                              xmlParserInputBufferPtr *out) {
    xmlParserInputBufferPtr buf;
    xmlParserErrors ret;
    int i;

    xmlInitParser();

    *out = NULL;
    if (URI == NULL)
        return(XML_ERR_ARGUMENT);

    /*
     * Allocate the Input buffer front-end.
     */
    buf = xmlAllocParserInputBuffer(enc);
    if (buf == NULL)
        return(XML_ERR_NO_MEMORY);

    /*
     * Try to find one of the input accept method accepting that scheme
     * Go in reverse to give precedence to user defined handlers.
     */
    ret = XML_IO_ENOENT;
    for (i = xmlInputCallbackNr - 1; i >= 0; i--) {
        xmlInputCallback *cb = &xmlInputCallbackTable[i];

        if (cb->matchcallback == xmlIODefaultMatch) {
            ret = xmlInputDefaultOpen(buf, URI, flags);

            if ((ret == XML_ERR_OK) || (ret != XML_IO_ENOENT))
                break;
        } else if ((cb->matchcallback != NULL) &&
                   (cb->matchcallback(URI) != 0)) {
            buf->context = cb->opencallback(URI);
            if (buf->context != NULL) {
                buf->readcallback = cb->readcallback;
                buf->closecallback = cb->closecallback;
                ret = XML_ERR_OK;
                break;
            }
        }
    }
    if (ret != XML_ERR_OK) {
        xmlFreeParserInputBuffer(buf);
        *out = NULL;
	return(ret);
    }

    *out = buf;
    return(ret);
}